

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O0

int acmod_process_full_raw(acmod_t *acmod,int16 **inout_raw,size_t *inout_n_samps)

{
  int iVar1;
  int iVar2;
  int16 *piVar3;
  mfcc_t **local_38;
  mfcc_t **cepptr;
  int32 ntail;
  int32 nfr;
  size_t *inout_n_samps_local;
  int16 **inout_raw_local;
  acmod_t *acmod_local;
  
  _ntail = inout_n_samps;
  inout_n_samps_local = (size_t *)inout_raw;
  inout_raw_local = (int16 **)acmod;
  if (acmod->rawfh != (FILE *)0x0) {
    fwrite(*inout_raw,2,*inout_n_samps,(FILE *)acmod->rawfh);
  }
  iVar1 = fe_process_frames((fe_t *)inout_raw_local[3],(int16 **)0x0,_ntail,(mfcc_t **)0x0,
                            (int32 *)((long)&cepptr + 4));
  if (iVar1 < 0) {
    acmod_local._4_4_ = -1;
  }
  else {
    if (*(int *)(inout_raw_local + 0x16) < cepptr._4_4_ + 1) {
      ckd_free_2d(inout_raw_local[0xe]);
      iVar1 = cepptr._4_4_ + 1;
      iVar2 = fe_get_output_size((fe_t *)inout_raw_local[3]);
      piVar3 = (int16 *)__ckd_calloc_2d__((long)iVar1,(long)iVar2,4,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                                          ,0x223);
      inout_raw_local[0xe] = piVar3;
      *(int *)(inout_raw_local + 0x16) = cepptr._4_4_ + 1;
    }
    *(undefined4 *)((long)inout_raw_local + 0xb4) = 0;
    *(undefined4 *)(inout_raw_local + 0x17) = 0;
    fe_start_utt((fe_t *)inout_raw_local[3]);
    iVar1 = fe_process_frames((fe_t *)inout_raw_local[3],(int16 **)inout_n_samps_local,_ntail,
                              (mfcc_t **)inout_raw_local[0xe],(int32 *)((long)&cepptr + 4));
    if (iVar1 < 0) {
      acmod_local._4_4_ = -1;
    }
    else {
      fe_end_utt((fe_t *)inout_raw_local[3],
                 *(mfcc_t **)(inout_raw_local[0xe] + (long)cepptr._4_4_ * 4),(int32 *)&cepptr);
      cepptr._4_4_ = (int)cepptr + cepptr._4_4_;
      local_38 = (mfcc_t **)inout_raw_local[0xe];
      acmod_local._4_4_ =
           acmod_process_full_cep((acmod_t *)inout_raw_local,&local_38,(int *)((long)&cepptr + 4));
      *(undefined4 *)((long)inout_raw_local + 0xb4) = 0;
    }
  }
  return acmod_local._4_4_;
}

Assistant:

static int
acmod_process_full_raw(acmod_t *acmod,
                       int16 const **inout_raw,
                       size_t *inout_n_samps)
{
    int32 nfr, ntail;
    mfcc_t **cepptr;

    /* Write to logging file if any. */
    if (acmod->rawfh)
        fwrite(*inout_raw, 2, *inout_n_samps, acmod->rawfh);
    /* Resize mfc_buf to fit. */
    if (fe_process_frames(acmod->fe, NULL, inout_n_samps, NULL, &nfr) < 0)
        return -1;
    if (acmod->n_mfc_alloc < nfr + 1) {
        ckd_free_2d(acmod->mfc_buf);
        acmod->mfc_buf = ckd_calloc_2d(nfr + 1, fe_get_output_size(acmod->fe),
                                       sizeof(**acmod->mfc_buf));
        acmod->n_mfc_alloc = nfr + 1;
    }
    acmod->n_mfc_frame = 0;
    acmod->mfc_outidx = 0;
    fe_start_utt(acmod->fe);
    if (fe_process_frames(acmod->fe, inout_raw, inout_n_samps,
                          acmod->mfc_buf, &nfr) < 0)
        return -1;
    fe_end_utt(acmod->fe, acmod->mfc_buf[nfr], &ntail);
    nfr += ntail;

    cepptr = acmod->mfc_buf;
    nfr = acmod_process_full_cep(acmod, &cepptr, &nfr);
    acmod->n_mfc_frame = 0;
    return nfr;
}